

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bz2_stream.cpp
# Opt level: O3

void __thiscall minibag::BZ2Stream::startWrite(BZ2Stream *this)

{
  FILE *f;
  BZFILE *b;
  runtime_error *this_00;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  f = Stream::getFilePointer(&this->super_Stream);
  b = BZ2_bzWriteOpen(&this->bzerror_,f,this->block_size_100k_,this->verbosity_,this->work_factor_);
  this->bzfile_ = b;
  if (this->bzerror_ == 0) {
    Stream::setCompressedIn(&this->super_Stream,0);
    return;
  }
  BZ2_bzWriteClose(&this->bzerror_,b,0,(uint *)0x0,(uint *)0x0);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"Error opening file for writing compressed stream","");
  std::runtime_error::runtime_error(this_00,(string *)local_40);
  *(undefined ***)this_00 = &PTR__runtime_error_001506d8;
  __cxa_throw(this_00,&BagException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void BZ2Stream::startWrite() {
    bzfile_ = BZ2_bzWriteOpen(&bzerror_, getFilePointer(), block_size_100k_, verbosity_, work_factor_);

    switch (bzerror_) {
        case BZ_OK: break;
        default: {
            BZ2_bzWriteClose(&bzerror_, bzfile_, 0, NULL, NULL);
            throw BagException("Error opening file for writing compressed stream");
        }
    }

    setCompressedIn(0);
}